

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

size_t __thiscall
Assimp::ObjFileParser::getTexCoordVector
          (ObjFileParser *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array)

{
  size_t this_00;
  bool bVar1;
  DeadlyImportError *this_01;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  aiVector3t<float> local_74;
  undefined1 local_65;
  allocator local_51;
  string local_50;
  ai_real local_2c;
  float local_28;
  ai_real z;
  ai_real y;
  ai_real x;
  size_t numComponents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array_local;
  ObjFileParser *this_local;
  
  numComponents = (size_t)point3d_array;
  point3d_array_local = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this;
  _y = getNumComponentsInDataDefinition(this);
  if (_y == 2) {
    copyNextWord(this,this->m_buffer,0x1000);
    z = fast_atof(this->m_buffer);
    copyNextWord(this,this->m_buffer,0x1000);
    local_28 = fast_atof(this->m_buffer);
    local_2c = 0.0;
  }
  else {
    if (_y != 3) {
      local_65 = 1;
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_50,"OBJ: Invalid number of components",&local_51);
      DeadlyImportError::DeadlyImportError(this_01,&local_50);
      local_65 = 0;
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    copyNextWord(this,this->m_buffer,0x1000);
    z = fast_atof(this->m_buffer);
    copyNextWord(this,this->m_buffer,0x1000);
    local_28 = fast_atof(this->m_buffer);
    copyNextWord(this,this->m_buffer,0x1000);
    local_2c = fast_atof(this->m_buffer);
  }
  bVar1 = std::isfinite(z);
  if (!bVar1) {
    z = 0.0;
  }
  bVar1 = std::isfinite(local_28);
  if (!bVar1) {
    local_28 = 0.0;
  }
  bVar1 = std::isfinite(local_2c);
  this_00 = numComponents;
  if (!bVar1) {
    local_2c = 0.0;
  }
  aiVector3t<float>::aiVector3t(&local_74,z,local_28,local_2c);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_00,&local_74);
  _Var2 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
  (this->m_DataIt)._M_current = _Var2._M_current;
  return _y;
}

Assistant:

size_t ObjFileParser::getTexCoordVector( std::vector<aiVector3D> &point3d_array ) {
    size_t numComponents = getNumComponentsInDataDefinition();
    ai_real x, y, z;
    if( 2 == numComponents ) {
        copyNextWord( m_buffer, Buffersize );
        x = ( ai_real ) fast_atof( m_buffer );

        copyNextWord( m_buffer, Buffersize );
        y = ( ai_real ) fast_atof( m_buffer );
        z = 0.0;
    } else if( 3 == numComponents ) {
        copyNextWord( m_buffer, Buffersize );
        x = ( ai_real ) fast_atof( m_buffer );

        copyNextWord( m_buffer, Buffersize );
        y = ( ai_real ) fast_atof( m_buffer );

        copyNextWord( m_buffer, Buffersize );
        z = ( ai_real ) fast_atof( m_buffer );
    } else {
        throw DeadlyImportError( "OBJ: Invalid number of components" );
    }

    // Coerce nan and inf to 0 as is the OBJ default value
    if (!std::isfinite(x))
        x = 0;

    if (!std::isfinite(y))
        y = 0;

    if (!std::isfinite(z))
        z = 0;

    point3d_array.push_back( aiVector3D( x, y, z ) );
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
    return numComponents;
}